

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  pointer pcVar1;
  string local_38;
  
  if (this->FortranModuleDirectoryCreated == false) {
    CreateFortranModuleDirectory(&local_38,this,working_dir);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    this->FortranModuleDirectoryCreated = true;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->FortranModuleDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->FortranModuleDirectory)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFortranModuleDirectory(
  std::string const& working_dir) const
{
  if (!this->FortranModuleDirectoryCreated) {
    this->FortranModuleDirectory =
      this->CreateFortranModuleDirectory(working_dir);
    this->FortranModuleDirectoryCreated = true;
  }

  return this->FortranModuleDirectory;
}